

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_reset(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  bool bVar4;
  size_t sVar5;
  State *this_00;
  char msg [36];
  State local_a8;
  
  if ((this->m_stack).m_size != 1) {
    local_a8.node_id._0_1_ = '_';
    local_a8.node_id._1_1_ = 's';
    local_a8.node_id._2_1_ = 't';
    local_a8.node_id._3_1_ = 'a';
    local_a8.node_id._4_1_ = 'c';
    local_a8.node_id._5_1_ = 'k';
    local_a8.node_id._6_1_ = '.';
    local_a8.node_id._7_1_ = 's';
    local_a8.scalar.str = (char *)0x3d3d202928657a69;
    local_a8._0_8_ = 0x6166206b63656863;
    local_a8.level._0_1_ = 'i';
    local_a8.level._1_1_ = 'l';
    local_a8.level._2_1_ = 'e';
    local_a8.level._3_1_ = 'd';
    local_a8.level._4_1_ = ':';
    local_a8.level._5_1_ = ' ';
    local_a8.level._6_1_ = '(';
    local_a8.level._7_1_ = 'm';
    local_a8.scalar.len = CONCAT44(local_a8.scalar.len._4_4_,0x293120);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    auVar3 = ZEXT1224(ZEXT412(0x6b6f) << 0x40);
    LVar2.name.str._0_4_ = 0x24bb3d;
    LVar2.super_LineCol.offset = auVar3._0_8_;
    LVar2.super_LineCol.line = auVar3._8_8_;
    LVar2.super_LineCol.col = auVar3._16_8_;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x24,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  (this->m_stack).m_size = 0;
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  memset(&local_a8.level,0,0x90);
  detail::stack<c4::yml::Parser::State,_16UL>::push(&this->m_stack,&local_a8);
  sVar5 = (this->m_stack).m_size;
  if (sVar5 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_a8._0_8_ = 0;
    local_a8.level = 0x5c5c;
    local_a8.node_id = 0;
    local_a8.scalar.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_a8.scalar.len = 0x65;
    (*(code *)PTR_error_impl_0029d7a8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar5 = (this->m_stack).m_size;
  }
  this_00 = (this->m_stack).m_stack + (sVar5 - 1);
  this->m_state = this_00;
  State::reset(this_00,(this->m_file).str,this->m_root_id);
  *(undefined8 *)((long)&(this->m_val_tag).str + 1) = 0;
  *(undefined8 *)((long)&(this->m_val_tag).len + 1) = 0;
  this->m_val_tag_indentation = 0;
  (this->m_val_tag).str = (char *)0x0;
  (this->m_key_tag2).str = (char *)0x0;
  (this->m_key_tag2).len = 0;
  (this->m_key_tag).str = (char *)0x0;
  (this->m_key_tag).len = 0;
  this->m_key_tag_indentation = 0;
  this->m_key_tag2_indentation = 0;
  this->m_key_anchor_indentation = 0;
  (this->m_key_anchor).str = (char *)0x0;
  (this->m_key_anchor).len = 0;
  this->m_val_anchor_indentation = 0;
  (this->m_val_anchor).str = (char *)0x0;
  (this->m_val_anchor).len = 0;
  if (((this->m_options).flags & 1) != 0) {
    _prepare_locations(this);
  }
  return;
}

Assistant:

void Parser::_reset()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.size() == 1);
    m_stack.clear();
    m_stack.push({});
    m_state = &m_stack.top();
    m_state->reset(m_file.str, m_root_id);

    m_key_tag_indentation = 0;
    m_key_tag2_indentation = 0;
    m_key_tag.clear();
    m_key_tag2.clear();
    m_val_tag_indentation = 0;
    m_val_tag.clear();
    m_key_anchor_was_before = false;
    m_key_anchor_indentation = 0;
    m_key_anchor.clear();
    m_val_anchor_indentation = 0;
    m_val_anchor.clear();

    if(m_options.locations())
    {
        _prepare_locations();
    }
}